

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  int sz;
  int tga_comp;
  int tga_h;
  int tga_w;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  if (bVar1 < 2) {
    bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffcc,(uint)bVar1));
    uVar2 = (uint)bVar1;
    if (((((uVar2 == 1) || (uVar2 == 2)) || (uVar2 == 3)) || ((uVar2 == 9 || (uVar2 == 10)))) ||
       (uVar2 == 0xb)) {
      stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
      iVar3 = stbi__get16le((stbi__context *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if (iVar3 < 1) {
        stbi__rewind(in_RDI);
        local_4 = 0;
      }
      else {
        iVar4 = stbi__get16le((stbi__context *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
        if (iVar4 < 1) {
          stbi__rewind(in_RDI);
          local_4 = 0;
        }
        else {
          bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
          uVar2 = (uint)bVar1;
          if (((uVar2 == 8) || (uVar2 == 0x10)) || ((uVar2 == 0x18 || (uVar2 == 0x20)))) {
            if (in_RSI != (int *)0x0) {
              *in_RSI = iVar3;
            }
            if (in_RDX != (int *)0x0) {
              *in_RDX = iVar4;
            }
            if (in_RCX != (uint *)0x0) {
              *in_RCX = uVar2 / 8;
            }
            local_4 = 1;
          }
          else {
            stbi__rewind(in_RDI);
            local_4 = 0;
          }
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp;
    int sz;
    stbi__get8(s);                   // discard Offset
    sz = stbi__get8(s);              // color type
    if( sz > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    sz = stbi__get8(s);              // image type
    // only RGB or grey allowed, +/- RLE
    if ((sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11)) return 0;
    stbi__skip(s,9);
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    sz = stbi__get8(s);               // bits per pixel
    // only RGB or RGBA or grey allowed
    if ((sz != 8) && (sz != 16) && (sz != 24) && (sz != 32)) {
        stbi__rewind(s);
        return 0;
    }
    tga_comp = sz;
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp / 8;
    return 1;                   // seems to have passed everything
}